

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O2

void __thiscall riffcpp::Chunk::Chunk(Chunk *this,char *filename)

{
  char cVar1;
  FourCC FVar2;
  uint32_t uVar3;
  impl *piVar4;
  undefined4 *puVar5;
  char *pcVar6;
  undefined4 uVar7;
  streampos sVar8;
  shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> stream;
  __shared_ptr<std::istream,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<std::istream,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  char *filename_local;
  
  filename_local = filename;
  piVar4 = (impl *)operator_new(0x48);
  (piVar4->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (piVar4->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (piVar4->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (piVar4->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (piVar4->m_pos)._M_off = 0;
  (piVar4->m_pos)._M_state.__count = 0;
  (piVar4->m_pos)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  (piVar4->m_limit)._M_off = 0;
  (piVar4->m_limit)._M_state.__count = 0;
  (piVar4->m_limit)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  piVar4->m_id = (_Type)0x0;
  piVar4->m_size = 0;
  this->pimpl = piVar4;
  std::make_shared<std::ifstream,char_const*&,std::_Ios_Openmode_const&>
            ((char **)&stream,(_Ios_Openmode *)&filename_local);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    pcVar6 = "Couldn\'t open specified file";
    uVar7 = 1;
  }
  else {
    std::__shared_ptr<std::istream,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<std::istream,(__gnu_cxx::_Lock_policy)2> *)this->pimpl,
               &stream.
                super___shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              );
    sVar8 = (streampos)std::istream::tellg();
    this->pimpl->m_pos = sVar8;
    uVar7 = 2;
    std::istream::seekg((long)(this->pimpl->m_stream).
                              super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,_S_beg);
    sVar8 = (streampos)std::istream::tellg();
    this->pimpl->m_limit = sVar8;
    std::__shared_ptr<std::istream,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<std::ifstream,void>
              (local_38,&stream.
                         super___shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              );
    FVar2 = read_id((shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> *)local_38,
                    this->pimpl->m_pos);
    *&(this->pimpl->m_id)._M_elems = FVar2._M_elems;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    std::__shared_ptr<std::istream,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<std::ifstream,void>
              (local_48,&stream.
                         super___shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              );
    uVar3 = read_size((shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> *)local_48,
                      this->pimpl->m_pos);
    this->pimpl->m_size = uVar3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
    piVar4 = this->pimpl;
    if ((long)((ulong)piVar4->m_size + (piVar4->m_pos)._M_off) <= (piVar4->m_limit)._M_off) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&stream.
                  super___shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      return;
    }
    pcVar6 = "Chunk size outside of range";
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(0x10);
  *puVar5 = uVar7;
  *(char **)(puVar5 + 2) = pcVar6;
  __cxa_throw(puVar5,&Error::typeinfo,0);
}

Assistant:

riffcpp::Chunk::Chunk(const char *filename) {
  pimpl = new riffcpp::Chunk::impl();
  auto stream = std::make_shared<std::ifstream>(filename, std::ios::binary);

  if (!stream->is_open()) {
    throw Error("Couldn't open specified file", ErrorType::CannotOpenFile);
  }

  pimpl->m_stream = stream;
  pimpl->m_pos = pimpl->m_stream->tellg();

  pimpl->m_stream->seekg(0, std::ios::end);
  pimpl->m_limit = pimpl->m_stream->tellg();

  pimpl->m_id = read_id(stream, pimpl->m_pos);
  pimpl->m_size = read_size(stream, pimpl->m_pos);

  if (pimpl->m_pos + std::streamoff{pimpl->m_size} > pimpl->m_limit) {
    throw Error("Chunk size outside of range", ErrorType::InvalidFile);
  }
}